

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

reference __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>_>_>
::iterator::operator*(iterator *this)

{
  ctrl_t *pcVar1;
  key_arg<std::__cxx11::basic_string<char>_> *pkVar2;
  key_arg<std::__cxx11::basic_string<char>_> *pkVar3;
  key_arg<std::__cxx11::basic_string<char>_> *pkVar4;
  key_arg<std::__cxx11::basic_string<char>_> *pkVar5;
  uint64_t uVar6;
  key_arg<std::__cxx11::basic_string<char>_> *pkVar7;
  ulong uVar8;
  key_arg<std::__cxx11::basic_string<char>_> *in_RSI;
  iterator iVar9;
  
  pcVar1 = this->ctrl_;
  if (pcVar1 == (ctrl_t *)0x0) {
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::Descriptor::WellKnownType>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>>>
    ::iterator::operator*((iterator *)this);
LAB_0023fceb:
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::Descriptor::WellKnownType>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>>>
    ::iterator::operator*((iterator *)this);
  }
  else {
    if (pcVar1 == kEmptyGroup + 0x10) goto LAB_0023fceb;
    if (kSentinel < *pcVar1) {
      return (reference)(this->field_1).slot_;
    }
  }
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::Descriptor::WellKnownType>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>>>
  ::iterator::operator*((iterator *)this);
  pkVar2 = (key_arg<std::__cxx11::basic_string<char>_> *)
           (((key_arg<std::__cxx11::basic_string<char>_> *)this)->_M_dataplus)._M_p;
  if ((pkVar2 == (key_arg<std::__cxx11::basic_string<char>_> *)(kEmptyGroup + 0x10) ||
       pkVar2 == (key_arg<std::__cxx11::basic_string<char>_> *)0x0) ||
     (-1 < *(char *)&(pkVar2->_M_dataplus)._M_p)) {
    pkVar3 = (key_arg<std::__cxx11::basic_string<char>_> *)(in_RSI->_M_dataplus)._M_p;
    if ((pkVar3 == (key_arg<std::__cxx11::basic_string<char>_> *)(kEmptyGroup + 0x10) ||
         pkVar3 == (key_arg<std::__cxx11::basic_string<char>_> *)0x0) ||
       (-1 < *(char *)&(pkVar3->_M_dataplus)._M_p)) {
      if (pkVar2 == (key_arg<std::__cxx11::basic_string<char>_> *)(kEmptyGroup + 0x10) &&
          pkVar3 == (key_arg<std::__cxx11::basic_string<char>_> *)(kEmptyGroup + 0x10)) {
LAB_0023fdc5:
        return (reference)CONCAT71((int7)((ulong)pkVar2 >> 8),pkVar2 == pkVar3);
      }
      if ((pkVar2 == (key_arg<std::__cxx11::basic_string<char>_> *)(kEmptyGroup + 0x10)) !=
          (pkVar3 == (key_arg<std::__cxx11::basic_string<char>_> *)(kEmptyGroup + 0x10)))
      goto LAB_0023fde1;
      if (pkVar2 == (key_arg<std::__cxx11::basic_string<char>_> *)0x0 ||
          pkVar3 == (key_arg<std::__cxx11::basic_string<char>_> *)0x0) goto LAB_0023fdc5;
      if ((pkVar3 == (key_arg<std::__cxx11::basic_string<char>_> *)kSooControl) ==
          (pkVar2 == (key_arg<std::__cxx11::basic_string<char>_> *)kSooControl)) {
        this = (iterator *)((key_arg<std::__cxx11::basic_string<char>_> *)this)->_M_string_length;
        pkVar4 = (key_arg<std::__cxx11::basic_string<char>_> *)in_RSI->_M_string_length;
        if (pkVar2 == (key_arg<std::__cxx11::basic_string<char>_> *)kSooControl) {
          if ((key_arg<std::__cxx11::basic_string<char>_> *)this == pkVar4) goto LAB_0023fdc5;
        }
        else {
          pkVar7 = pkVar4;
          pkVar5 = pkVar3;
          in_RSI = (key_arg<std::__cxx11::basic_string<char>_> *)this;
          if (pkVar3 < pkVar2) {
            pkVar7 = (key_arg<std::__cxx11::basic_string<char>_> *)this;
            pkVar5 = pkVar2;
            in_RSI = pkVar4;
          }
          if ((pkVar5 < in_RSI) && (in_RSI <= pkVar7)) goto LAB_0023fdc5;
        }
      }
      container_internal::operator==();
      goto LAB_0023fdd7;
    }
  }
  else {
LAB_0023fdd7:
    container_internal::operator==();
  }
  container_internal::operator==();
LAB_0023fde1:
  container_internal::operator==();
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>_>_>
              *)this);
  uVar8 = in_RSI->_M_string_length;
  uVar6 = hash_internal::MixingHashState::CombineContiguousImpl
                    (&hash_internal::MixingHashState::kSeed,(in_RSI->_M_dataplus)._M_p,uVar8);
  uVar8 = (uVar8 ^ uVar6) * -0x234dd359734ecb13;
  iVar9 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::Descriptor::WellKnownType>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>>>
          ::find_non_soo<std::__cxx11::string>
                    ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::Descriptor::WellKnownType>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>>>
                      *)this,in_RSI,
                     uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                     (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                     (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                     (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38);
  return (reference)iVar9.ctrl_;
}

Assistant:

reference operator*() const {
      AssertIsFull(ctrl_, generation(), generation_ptr(), "operator*()");
      return unchecked_deref();
    }